

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBb2Wb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_34;
  uint local_30;
  int fVerbose;
  int fSeq;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  local_34 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"svh"), iVar1 != -1) {
    if (iVar1 == 0x73) {
      local_30 = local_30 ^ 1;
    }
    else {
      if (iVar1 != 0x76) goto LAB_0023830c;
      local_34 = local_34 ^ 1;
    }
  }
  if (argc == globalUtilOptind + 2) {
    Abc_NtkConvertBb2Wb(argv[globalUtilOptind],argv[globalUtilOptind + 1],local_30,local_34);
    pAbc_local._4_4_ = 0;
  }
  else {
    Abc_Print(-1,"Expecting two files names on the command line.\n");
LAB_0023830c:
    Abc_Print(-2,"usage: bb2wb [-svh] <file_in> <file_out>\n");
    Abc_Print(-2,"\t             replaces black boxes by white boxes with AND functions\n");
    Abc_Print(-2,"\t             (file names should have standard extensions, e.g. \"blif\")\n");
    pcVar2 = "no";
    if (local_30 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-s         : toggle using sequential white boxes [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_34 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v         : toggle verbose output [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h         : print the command usage\n");
    Abc_Print(-2,"\t<file_in>  : input file with design containing black boxes\n");
    Abc_Print(-2,"\t<file_out> : output file with design containing white boxes\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandBb2Wb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkConvertBb2Wb( char * pFileNameIn, char * pFileNameOut, int fSeq, int fVerbose );
    int c;
    int fSeq;
    int fVerbose;
    // set defaults
    fSeq = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Expecting two files names on the command line.\n" );
        goto usage;
    }
    Abc_NtkConvertBb2Wb( argv[globalUtilOptind], argv[globalUtilOptind+1], fSeq, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: bb2wb [-svh] <file_in> <file_out>\n" );
    Abc_Print( -2, "\t             replaces black boxes by white boxes with AND functions\n" );
    Abc_Print( -2, "\t             (file names should have standard extensions, e.g. \"blif\")\n" );
    Abc_Print( -2, "\t-s         : toggle using sequential white boxes [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v         : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file_in>  : input file with design containing black boxes\n");
    Abc_Print( -2, "\t<file_out> : output file with design containing white boxes\n");
    return 1;
}